

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int lhConsumeCellkey(lhcell *pCell,_func_int_void_ptr_uint_void_ptr *xConsumer,void *pUserData,
                    int offt_only)

{
  pgno local_78;
  pgno iOvfl;
  unqlite_page *puStack_68;
  int data_offset;
  unqlite_page *pOvfl;
  sxu32 nData;
  sxu32 nByte;
  lhash_kv_engine *pEngine;
  uchar *puStack_48;
  int rc;
  uchar *zPayload;
  uchar *zRaw;
  lhpage *pPage;
  void *pvStack_28;
  int offt_only_local;
  void *pUserData_local;
  _func_int_void_ptr_uint_void_ptr *xConsumer_local;
  lhcell *pCell_local;
  
  zRaw = (uchar *)pCell->pPage;
  zPayload = ((lhpage *)zRaw)->pRaw->zData;
  puStack_48 = zPayload + pCell->iStart;
  pPage._4_4_ = offt_only;
  pvStack_28 = pUserData;
  pUserData_local = xConsumer;
  xConsumer_local = (_func_int_void_ptr_uint_void_ptr *)pCell;
  if (pCell->iOvfl == 0) {
    puStack_48 = puStack_48 + 0x1a;
    pEngine._4_4_ = (*xConsumer)(puStack_48,pCell->nKey,pUserData);
    if (pEngine._4_4_ != 0) {
      pEngine._4_4_ = -10;
    }
  }
  else {
    _nData = ((lhpage *)zRaw)->pHash;
    pOvfl._0_4_ = pCell->nKey;
    iOvfl._4_4_ = 0;
    local_78 = pCell->iOvfl;
    pOvfl._4_4_ = _nData->iPageSize - 8;
    while ((local_78 != 0 && ((sxu32)pOvfl != 0))) {
      pEngine._4_4_ = (*_nData->pIo->xGet)(_nData->pIo->pHandle,local_78,&stack0xffffffffffffff98);
      if (pEngine._4_4_ != 0) {
        return pEngine._4_4_;
      }
      puStack_48 = puStack_68->zData + 8;
      if (iOvfl._4_4_ == 0) {
        SyBigEndianUnpack64(puStack_48,(sxu64 *)(xConsumer_local + 0x30));
        puStack_48 = puStack_48 + 8;
        SyBigEndianUnpack16(puStack_48,(sxu16 *)(xConsumer_local + 0x38));
        puStack_48 = puStack_48 + 2;
        if (pPage._4_4_ != 0) {
          (*_nData->pIo->xPageUnref)(puStack_68);
          return 0;
        }
        iOvfl._4_4_ = 1;
      }
      if (pOvfl._4_4_ < (sxu32)pOvfl) {
        pEngine._4_4_ = (*(code *)pUserData_local)(puStack_48,pOvfl._4_4_,pvStack_28);
        if (pEngine._4_4_ != 0) {
          (*_nData->pIo->xPageUnref)(puStack_68);
          return -10;
        }
        pOvfl._0_4_ = (sxu32)pOvfl - pOvfl._4_4_;
      }
      else {
        pEngine._4_4_ = (*(code *)pUserData_local)(puStack_48,(sxu32)pOvfl,pvStack_28);
        if (pEngine._4_4_ != 0) {
          (*_nData->pIo->xPageUnref)(puStack_68);
          return -10;
        }
        pOvfl._0_4_ = 0;
      }
      pEngine._4_4_ = 0;
      SyBigEndianUnpack64(puStack_68->zData,&local_78);
      (*_nData->pIo->xPageUnref)(puStack_68);
    }
    pEngine._4_4_ = 0;
  }
  return pEngine._4_4_;
}

Assistant:

static int lhConsumeCellkey(
	lhcell *pCell, /* Target cell */
	int (*xConsumer)(const void *,unsigned int,void *), /* Consumer callback */
	void *pUserData, /* Last argument to xConsumer() */
	int offt_only
	)
{
	lhpage *pPage = pCell->pPage;
	const unsigned char *zRaw = pPage->pRaw->zData;
	const unsigned char *zPayload;
	int rc;
	/* Point to the payload area */
	zPayload = &zRaw[pCell->iStart];
	if( pCell->iOvfl == 0 ){
		/* Best scenario, consume the key directly without any overflow page */
		zPayload += L_HASH_CELL_SZ;
		rc = xConsumer((const void *)zPayload,pCell->nKey,pUserData);
		if( rc != UNQLITE_OK ){
			rc = UNQLITE_ABORT;
		}
	}else{
		lhash_kv_engine *pEngine = pPage->pHash;
		sxu32 nByte,nData = pCell->nKey;
		unqlite_page *pOvfl;
		int data_offset = 0;
		pgno iOvfl;
		/* Overflow page */
		iOvfl = pCell->iOvfl;
		/* Total usable bytes in an overflow page */
		nByte = L_HASH_OVERFLOW_SIZE(pEngine->iPageSize);
		for(;;){
			if( iOvfl == 0 || nData < 1 ){
				/* no more overflow page */
				break;
			}
			/* Point to the overflow page */
			rc = pEngine->pIo->xGet(pEngine->pIo->pHandle,iOvfl,&pOvfl);
			if( rc != UNQLITE_OK ){
				return rc;
			}
			zPayload = &pOvfl->zData[8];
			/* Point to the raw content */
			if( !data_offset ){
				/* Get the data page and offset */
				SyBigEndianUnpack64(zPayload,&pCell->iDataPage);
				zPayload += 8;
				SyBigEndianUnpack16(zPayload,&pCell->iDataOfft);
				zPayload += 2;
				if( offt_only ){
					/* Key too large, grab the data offset and return */
					pEngine->pIo->xPageUnref(pOvfl);
					return UNQLITE_OK;
				}
				data_offset = 1;
			}
			/* Consume the key */
			if( nData <= nByte ){
				rc = xConsumer((const void *)zPayload,nData,pUserData);
				if( rc != UNQLITE_OK ){
					pEngine->pIo->xPageUnref(pOvfl);
					return UNQLITE_ABORT;
				}
				nData = 0;
			}else{
				rc = xConsumer((const void *)zPayload,nByte,pUserData);
				if( rc != UNQLITE_OK ){
					pEngine->pIo->xPageUnref(pOvfl);
					return UNQLITE_ABORT;
				}
				nData -= nByte;
			}
			/* Next overflow page in the chain */
			SyBigEndianUnpack64(pOvfl->zData,&iOvfl);
			/* Unref the page */
			pEngine->pIo->xPageUnref(pOvfl);
		}
		rc = UNQLITE_OK;
	}
	return rc;
}